

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Preprocessor_macros.cpp
# Opt level: O1

MacroDef __thiscall slang::parsing::Preprocessor::findMacro(Preprocessor *this,Token directive)

{
  string_view sVar1;
  string_view name;
  Token local_30;
  MacroDef local_20;
  
  local_30.info = directive.info;
  local_30._0_8_ = directive._0_8_;
  sVar1 = Token::valueText(&local_30);
  if (sVar1._M_len != 0) {
    findMacro();
    return local_20;
  }
  std::__throw_out_of_range_fmt
            ("%s: __pos (which is %zu) > __size (which is %zu)","basic_string_view::substr",1,0);
}

Assistant:

Preprocessor::MacroDef Preprocessor::findMacro(Token directive) {
    std::string_view name = directive.valueText().substr(1);
    if (!name.empty() && name[0] == '\\')
        name = name.substr(1);

    auto it = macros.find(name);
    if (it == macros.end())
        return nullptr;
    return it->second;
}